

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O2

int nn_xsurveyor_create(void *hint,nn_sockbase **sockbase)

{
  nn_xsurveyor *self;
  
  self = (nn_xsurveyor *)nn_alloc_(0x1b0);
  if (self != (nn_xsurveyor *)0x0) {
    nn_xsurveyor_init(self,&nn_xsurveyor_sockbase_vfptr,hint);
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/xsurveyor.c"
          ,0xc1);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_xsurveyor_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xsurveyor *self;

    self = nn_alloc (sizeof (struct nn_xsurveyor), "socket (xsurveyor)");
    alloc_assert (self);
    nn_xsurveyor_init (self, &nn_xsurveyor_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}